

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

bool __thiscall
JsUtil::
BaseDictionary<unsigned_int,_Js::DynamicProfileInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::Remove(BaseDictionary<unsigned_int,_Js::DynamicProfileInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *this,uint *key)

{
  int iVar1;
  int *piVar2;
  uint uVar3;
  SimpleDictionaryEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_> *pSVar4;
  uint uVar5;
  uint depth;
  uint uVar6;
  
  piVar2 = (this->buckets).ptr;
  depth = 0;
  if (piVar2 != (int *)0x0) {
    uVar3 = GetBucket(*key * 2 + 1,this->bucketCount,this->modFunctionIndex);
    uVar5 = piVar2[uVar3];
    depth = 0;
    if (-1 < (long)(int)uVar5) {
      pSVar4 = (this->entries).ptr;
      if (pSVar4[(int)uVar5].
          super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
          .super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_>.
          super_ValueEntry<Memory::WriteBarrierPtr<Js::DynamicProfileInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_>_>
          .
          super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_>
          .key == *key) {
        depth = 0;
        uVar6 = 0xffffffff;
      }
      else {
        depth = 0;
        do {
          uVar6 = uVar5;
          depth = depth + 1;
          uVar5 = pSVar4[uVar6].
                  super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .
                  super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_>
                  .
                  super_ValueEntry<Memory::WriteBarrierPtr<Js::DynamicProfileInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_>_>
                  .
                  super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_>
                  .next;
          if ((long)(int)uVar5 < 0) goto LAB_00b001b3;
        } while (pSVar4[(int)uVar5].
                 super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                 .
                 super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_>
                 .
                 super_ValueEntry<Memory::WriteBarrierPtr<Js::DynamicProfileInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_>_>
                 .
                 super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_>
                 .key != *key);
      }
      if (this->stats != (DictionaryStats *)0x0) {
        DictionaryStats::Lookup(this->stats,depth);
        pSVar4 = (this->entries).ptr;
      }
      iVar1 = pSVar4[uVar5].
              super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
              .super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_>.
              super_ValueEntry<Memory::WriteBarrierPtr<Js::DynamicProfileInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_>_>
              .
              super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_>
              .next;
      if ((int)uVar6 < 0) {
        (this->buckets).ptr[uVar3] = iVar1;
      }
      else {
        pSVar4[uVar6].
        super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
        .super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_>.
        super_ValueEntry<Memory::WriteBarrierPtr<Js::DynamicProfileInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_>_>
        .
        super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_>
        .next = iVar1;
      }
      Memory::Recycler::WBSetBit((char *)(pSVar4 + uVar5));
      pSVar4[uVar5].
      super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
      .super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_>.
      super_ValueEntry<Memory::WriteBarrierPtr<Js::DynamicProfileInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_>_>
      .
      super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_>
      .value.ptr = (DynamicProfileInfo *)0x0;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(pSVar4 + uVar5);
      pSVar4[uVar5].
      super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
      .super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_>.
      super_ValueEntry<Memory::WriteBarrierPtr<Js::DynamicProfileInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_>_>
      .
      super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::DynamicProfileInfo>_>
      .key = 0;
      SetNextFreeEntryIndex
                (this,(this->entries).ptr + uVar5,-(uint)(this->freeCount == 0) | this->freeList);
      this->freeList = uVar5;
      this->freeCount = this->freeCount + 1;
      if (this->stats == (DictionaryStats *)0x0) {
        return true;
      }
      DictionaryStats::Remove(this->stats,(this->buckets).ptr[uVar3] == -1);
      return true;
    }
  }
LAB_00b001b3:
  if (this->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this->stats,depth);
  }
  return false;
}

Assistant:

bool Remove(const TKey& key)
        {
            int i, last;
            uint targetBucket;
            if(FindEntryWithKey(key, &i, &last, &targetBucket))
            {
                RemoveAt(i, last, targetBucket);
                return true;
            }
            return false;
        }